

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RandJoinClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RandJoinClauseSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ParenthesizedExpressionSyntax*&>
          (BumpAllocator *this,Token *args,Token *args_1,ParenthesizedExpressionSyntax **args_2)

{
  Token rand;
  Token join;
  RandJoinClauseSyntax *this_00;
  ParenthesizedExpressionSyntax **args_local_2;
  Token *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (RandJoinClauseSyntax *)allocate(this,0x38,8);
  rand.kind = args->kind;
  rand._2_1_ = args->field_0x2;
  rand.numFlags.raw = (args->numFlags).raw;
  rand.rawLen = args->rawLen;
  rand.info = args->info;
  join.kind = args_1->kind;
  join._2_1_ = args_1->field_0x2;
  join.numFlags.raw = (args_1->numFlags).raw;
  join.rawLen = args_1->rawLen;
  join.info = args_1->info;
  slang::syntax::RandJoinClauseSyntax::RandJoinClauseSyntax(this_00,rand,join,*args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }